

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void get_loc_or_ref(DynBuf *bc,BOOL is_ref,int idx)

{
  uint in_EDX;
  int in_ESI;
  uint16_t in_stack_ffffffffffffffee;
  uint8_t c;
  
  c = (uint8_t)(in_stack_ffffffffffffffee >> 8);
  if (in_ESI == 0) {
    dbuf_putc((DynBuf *)(ulong)in_EDX,c);
  }
  else {
    dbuf_putc((DynBuf *)CONCAT44(in_ESI,in_EDX),c);
  }
  dbuf_put_u16((DynBuf *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffee);
  return;
}

Assistant:

static void get_loc_or_ref(DynBuf *bc, BOOL is_ref, int idx)
{
    /* if the field is not initialized, the error is catched when
       accessing it */
    if (is_ref) 
        dbuf_putc(bc, OP_get_var_ref);
    else
        dbuf_putc(bc, OP_get_loc);
    dbuf_put_u16(bc, idx);
}